

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::
Stack<std::unique_ptr<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>_>
::expand(Stack<std::unique_ptr<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>_>
         *this)

{
  TermMatcher *pTVar1;
  TermMatcher *this_00;
  unique_ptr<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
  *in_RDI;
  size_t i;
  unique_ptr<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
  *newStack;
  void *mem;
  size_t newCapacity;
  TermMatcher *pTVar2;
  TermMatcher *local_28;
  
  if ((in_RDI->_M_t).
      super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
      .
      super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>
      ._M_head_impl == (TermMatcher *)0x0) {
    pTVar1 = (TermMatcher *)0x8;
  }
  else {
    pTVar1 = (TermMatcher *)
             ((long)(in_RDI->_M_t).
                    super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
                    .
                    super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>
                    ._M_head_impl << 1);
  }
  pTVar2 = pTVar1;
  this_00 = (TermMatcher *)Lib::alloc((size_t)in_RDI);
  if ((in_RDI->_M_t).
      super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
      .
      super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>
      ._M_head_impl != (TermMatcher *)0x0) {
    for (local_28 = (TermMatcher *)0x0;
        local_28 <
        (in_RDI->_M_t).
        super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
        ._M_t.
        super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
        .
        super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>
        ._M_head_impl;
        local_28 = (TermMatcher *)((long)&(local_28->super_Matcher).super_BaseMatcher.op + 1)) {
      std::
      unique_ptr<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
      ::unique_ptr(in_RDI,(unique_ptr<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
                           *)pTVar2);
      std::
      unique_ptr<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
      ::~unique_ptr((unique_ptr<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
                     *)this_00);
    }
    Lib::free(in_RDI[1]._M_t.
              super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
              ._M_t.
              super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
              .
              super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>
              ._M_head_impl);
  }
  in_RDI[1]._M_t.
  super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
  .super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>.
  _M_head_impl = this_00;
  in_RDI[2]._M_t.
  super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
  .super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>.
  _M_head_impl = (TermMatcher *)
                 ((long)&((in_RDI[1]._M_t.
                           super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
                           .
                           super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>
                          ._M_head_impl)->super_Matcher).super_BaseMatcher +
                 (long)(in_RDI->_M_t).
                       super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
                       .
                       super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>
                       ._M_head_impl * 8);
  in_RDI[3]._M_t.
  super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
  .super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>.
  _M_head_impl = (TermMatcher *)
                 ((long)&((in_RDI[1]._M_t.
                           super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
                           .
                           super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>
                          ._M_head_impl)->super_Matcher).super_BaseMatcher + (long)pTVar1 * 8);
  (in_RDI->_M_t).
  super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher>_>
  .super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::TermLiteralClause>::TermMatcher_*,_false>.
  _M_head_impl = pTVar1;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }